

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

void Curl_conncontrol(connectdata *conn,int ctrl)

{
  _Bool _Var1;
  
  _Var1 = true;
  if (ctrl != 1) {
    if (ctrl == 2) {
      if ((conn->handler->flags & 0x200) != 0) {
        return;
      }
    }
    else {
      _Var1 = false;
    }
  }
  if (_Var1 == (conn->bits).close) {
    return;
  }
  (conn->bits).close = _Var1;
  return;
}

Assistant:

const char *reason
#endif
  )
{
  /* close if a connection, or a stream that isn't multiplexed */
  bool closeit = (ctrl == CONNCTRL_CONNECTION) ||
    ((ctrl == CONNCTRL_STREAM) && !(conn->handler->flags & PROTOPT_STREAM));
  if((ctrl == CONNCTRL_STREAM) &&
     (conn->handler->flags & PROTOPT_STREAM))
    DEBUGF(infof(conn->data, "Kill stream: %s\n", reason));
  else if(closeit != conn->bits.close) {
    DEBUGF(infof(conn->data, "Marked for [%s]: %s\n",
                 closeit?"closure":"keep alive", reason));
    conn->bits.close = closeit; /* the only place in the source code that
                                   should assign this bit */
  }
}